

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void array_container_grow(array_container_t *container,int32_t min,_Bool preserve)

{
  uint uVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  uint uVar4;
  uint16_t **ppuVar5;
  uint uVar6;
  
  uVar6 = 0x1000;
  if (0x1000 < min) {
    uVar6 = 0x10000;
  }
  uVar1 = container->capacity;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  else if (uVar1 < 0x40) {
    uVar1 = uVar1 * 2;
  }
  else {
    if (uVar1 < 0x400) {
      uVar4 = uVar1 >> 1;
    }
    else {
      uVar4 = uVar1 >> 2;
    }
    uVar1 = uVar1 + uVar4;
  }
  if (uVar1 < uVar6) {
    uVar6 = uVar1;
  }
  if ((int)uVar1 < min) {
    uVar6 = min;
  }
  container->capacity = uVar6;
  puVar3 = container->array;
  ppuVar5 = &container->array;
  if (preserve) {
    puVar2 = (uint16_t *)realloc(puVar3,(ulong)(uVar6 * 2));
    *ppuVar5 = puVar2;
    if (puVar2 != (uint16_t *)0x0) {
      return;
    }
    free(puVar3);
    puVar3 = *ppuVar5;
  }
  else {
    if (puVar3 != (uint16_t *)0x0) {
      free(puVar3);
    }
    puVar3 = (uint16_t *)malloc((ulong)(uVar6 * 2));
    *ppuVar5 = puVar3;
  }
  if (puVar3 == (uint16_t *)0x0) {
    array_container_grow_cold_1();
  }
  return;
}

Assistant:

void array_container_grow(array_container_t *container, int32_t min,
                          bool preserve) {

    int32_t max = (min <= DEFAULT_MAX_SIZE ? DEFAULT_MAX_SIZE : 65536);
    int32_t new_capacity = clamp(grow_capacity(container->capacity), min, max);

    container->capacity = new_capacity;
    uint16_t *array = container->array;

    if (preserve) {
        container->array =
            (uint16_t *)realloc(array, new_capacity * sizeof(uint16_t));
        if (container->array == NULL) free(array);
    } else {
        // Jon Strabala reports that some tools complain otherwise
        if (array != NULL) {
          free(array);
        }
        container->array = (uint16_t *)malloc(new_capacity * sizeof(uint16_t));
    }

    //  handle the case where realloc fails
    if (container->array == NULL) {
      fprintf(stderr, "could not allocate memory\n");
    }
    assert(container->array != NULL);
}